

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

void __thiscall Trie::insert(Trie *this,char *text,size_t value)

{
  pointer pNVar1;
  size_t sVar2;
  iterator iVar3;
  mapped_type_conflict *pmVar4;
  _Base_ptr p_Var5;
  LookupEntry lookupEntry;
  LookupEntry lookupEntry_1;
  
  p_Var5 = (_Base_ptr)0x0;
  for (; lookupEntry.input = *text, lookupEntry.input != '\0'; text = text + 1) {
    lookupEntry.node = (size_t)p_Var5;
    iVar3 = std::
            _Rb_tree<Trie::LookupEntry,_std::pair<const_Trie::LookupEntry,_unsigned_long>,_std::_Select1st<std::pair<const_Trie::LookupEntry,_unsigned_long>_>,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
            ::find(&(this->lookup)._M_t,&lookupEntry);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->lookup)._M_t._M_impl.super__Rb_tree_header)
    break;
    p_Var5 = iVar3._M_node[1]._M_left;
  }
  for (; *text != '\0'; text = text + 1) {
    lookupEntry.node =
         ((long)(this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)(this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x18;
    lookupEntry.input = '\0';
    std::vector<Trie::Node,_std::allocator<Trie::Node>_>::push_back
              (&this->nodes,(value_type *)&lookupEntry);
    sVar2 = lookupEntry.node;
    lookupEntry_1.input = *text;
    lookupEntry_1.node = (size_t)p_Var5;
    pmVar4 = std::
             map<Trie::LookupEntry,_unsigned_long,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
             ::operator[](&this->lookup,&lookupEntry_1);
    *pmVar4 = sVar2;
    p_Var5 = (_Base_ptr)lookupEntry.node;
  }
  pNVar1 = (this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1[(long)p_Var5].hasValue = true;
  pNVar1[(long)p_Var5].value = value;
  return;
}

Assistant:

void Trie::insert(const char* text, size_t value)
{
	size_t node = 0;	// root node

	// traverse existing nodes
	while (*text != 0)
	{
		LookupEntry lookupEntry { node, *text };
		auto it = lookup.find(lookupEntry);
		if (it == lookup.end())
			break;

		node = it->second;
		text++;
	}

	// add new nodes as necessary
	while (*text != 0)
	{
		Node newNode { nodes.size(), false, 0 };
		nodes.push_back(newNode);

		LookupEntry lookupEntry { node, *text };
		lookup[lookupEntry] = newNode.index;
		node = newNode.index;
		text++;
	}

	// set value
	nodes[node].hasValue = true;
	nodes[node].value = value;
}